

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

double __thiscall
despot::Function::ComputeConstrainedMinimum(Function *this,NamedVar *var,int value)

{
  int iVar1;
  int iVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar3;
  invalid_argument *this_01;
  string *__rhs;
  const_reference ppNVar4;
  uint *puVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  uint local_114;
  undefined1 local_110 [4];
  int c;
  vector<int,_std::allocator<int>_> vec;
  int p_1;
  int i;
  int id;
  int p;
  double min;
  int child_size;
  int parent_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint local_1c;
  NamedVar *pNStack_18;
  int value_local;
  NamedVar *var_local;
  Function *this_local;
  
  local_1c = value;
  pNStack_18 = var;
  var_local = (NamedVar *)this;
  this_00 = Variable::values_abi_cxx11_(&var->super_Variable);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(this_00);
  if (sVar3 <= (ulong)(long)(int)local_1c) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    __rhs = NamedVar::name_abi_cxx11_(pNStack_18);
    std::operator+(&local_a0,"Variable ",__rhs);
    std::operator+(&local_80,&local_a0," cannot have value ");
    to_string<int>((string *)&parent_size,local_1c);
    std::operator+(&local_60,&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parent_size
                  );
    std::operator+(&local_40,&local_60,".");
    std::invalid_argument::invalid_argument(this_01,(string *)&local_40);
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar1 = (*this->_vptr_Function[7])();
  iVar2 = (*this->_vptr_Function[9])();
  _id = INFINITY;
  if (pNStack_18 == this->child_) {
    for (i = 0; i < iVar1; i = i + 1) {
      (*this->_vptr_Function[4])(this,(ulong)(uint)i,(ulong)local_1c);
      if (extraout_XMM0_Qa < _id) {
        (*this->_vptr_Function[4])(this,(ulong)(uint)i,(ulong)local_1c);
        _id = extraout_XMM0_Qa_00;
      }
    }
  }
  else {
    p_1 = -1;
    for (vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < iVar1;
        vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1) {
      ppNVar4 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                          (&this->parents_,
                           (long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_);
      if (*ppNVar4 == pNStack_18) {
        p_1 = vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_;
        break;
      }
    }
    for (vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 0;
        (int)(uint)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_end_of_storage < iVar1;
        vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (uint)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_end_of_storage + 1) {
      Variable::ComputeIndexVec
                ((vector<int,_std::allocator<int>_> *)local_110,&this->parents_,
                 (uint)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      if ((p_1 == -1) ||
         (puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)local_110,(long)p_1),
         *puVar5 == local_1c)) {
        for (local_114 = 0; (int)local_114 < iVar2; local_114 = local_114 + 1) {
          (*this->_vptr_Function[4])
                    (this,(ulong)(uint)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage,(ulong)local_114);
          if (extraout_XMM0_Qa_01 < _id) {
            (*this->_vptr_Function[4])
                      (this,(ulong)(uint)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage,(ulong)local_114)
            ;
            _id = extraout_XMM0_Qa_02;
          }
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_110);
    }
  }
  return _id;
}

Assistant:

double Function::ComputeConstrainedMinimum(const NamedVar* var,
	int value) const {
	if (var->values().size() <= value)
		throw std::invalid_argument(
			"Variable " + var->name() + " cannot have value " + to_string(value)
				+ ".");

	// cout << "Computing constrained minimum (" << var->name() << " = " << value << ")" << endl;
	// cout << *this << endl;
	int parent_size = ParentSize();
	int child_size = ChildSize();
	double min = Globals::POS_INFTY;
	if (var == child_) {
		for (int p = 0; p < parent_size; p++)
			if (GetValue(p, value) < min)
				min = GetValue(p, value);
	} else {
		int id = -1;
		for (int i = 0; i < parent_size; i++)
			if (parents_[i] == var) {
				id = i;
				break;
			}

		for (int p = 0; p < parent_size; p++) {
			vector<int> vec = Variable::ComputeIndexVec(parents_, p);
			if (id == -1 || vec[id] == value) {
				for (int c = 0; c < child_size; c++) {
					if (GetValue(p, c) < min) {
						min = GetValue(p, c);
					}
				}
			}
		}
	}
	// cout << "min = " << min << endl;

	return min;
}